

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  byte *pbVar1;
  handle hVar2;
  handle hVar3;
  undefined8 uVar4;
  handle hVar5;
  int iVar6;
  internals *this_00;
  type_info *ptVar7;
  object *poVar8;
  long *plVar9;
  PyTypeObject *pPVar10;
  long lVar11;
  size_t sVar12;
  char *__dest;
  handle hVar13;
  undefined8 *puVar14;
  mapped_type *pmVar15;
  mapped_type *ppvVar16;
  mapped_type *ppvVar17;
  byte bVar18;
  PyObject *pPVar19;
  size_type *psVar20;
  string meta_name_;
  object ht_qualname;
  object name;
  object scope_module;
  string full_name;
  object meta_name;
  object ht_qualname_meta;
  tuple bases;
  object metaclass;
  object scope_qualname;
  object type_holder;
  type_index tindex;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  handle local_128;
  handle local_120;
  handle local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [23];
  allocator<char> local_e9;
  undefined1 local_e8 [32];
  handle local_c8;
  handle local_c0;
  handle local_b8;
  object local_b0;
  generic_type *local_a8;
  handle local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  key_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_a8 = this;
  this_00 = get_internals();
  local_78._M_target = rec->type;
  ptVar7 = get_type_info(local_78._M_target,false);
  if (ptVar7 != (type_info *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,rec->name,(allocator<char> *)&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "generic_type: type \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    plVar9 = (long *)std::__cxx11::string::append(local_148);
    local_110._0_8_ = *plVar9;
    pPVar19 = (PyObject *)(plVar9 + 2);
    if ((PyObject *)local_110._0_8_ == pPVar19) {
      local_100._0_8_ = pPVar19->ob_refcnt;
      local_100._8_8_ = plVar9[3];
      local_110._0_8_ = (PyObject *)local_100;
    }
    else {
      local_100._0_8_ = pPVar19->ob_refcnt;
    }
    local_110._8_8_ = plVar9[1];
    *plVar9 = (long)pPVar19;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    pybind11_fail((string *)local_110);
  }
  local_120.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  local_118.m_ptr = (PyObject *)0x0;
  pPVar19 = (rec->scope).m_ptr;
  if (pPVar19 == (PyObject *)0x0) {
LAB_0011795b:
    local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    iVar6 = PyObject_HasAttrString(pPVar19,rec->name);
    if (iVar6 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,rec->name,(allocator<char> *)&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "generic_type: cannot initialize type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      plVar9 = (long *)std::__cxx11::string::append(local_148);
      local_110._0_8_ = *plVar9;
      pPVar19 = (PyObject *)(plVar9 + 2);
      if ((PyObject *)local_110._0_8_ == pPVar19) {
        local_100._0_8_ = pPVar19->ob_refcnt;
        local_100._8_8_ = plVar9[3];
        local_110._0_8_ = (PyObject *)local_100;
      }
      else {
        local_100._0_8_ = pPVar19->ob_refcnt;
      }
      local_110._8_8_ = plVar9[1];
      *plVar9 = (long)pPVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pybind11_fail((string *)local_110);
    }
    iVar6 = PyObject_HasAttrString((rec->scope).m_ptr,"__module__");
    if (iVar6 == 1) {
      local_110._8_8_ = (rec->scope).m_ptr;
      local_100._0_8_ = "__module__";
      local_100._8_8_ = (PyObject *)0x0;
      poVar8 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_110);
LAB_0011785c:
      local_148._0_8_ = (poVar8->super_handle).m_ptr;
      if ((PyObject *)local_148._0_8_ != (PyObject *)0x0) {
        ((PyObject *)local_148._0_8_)->ob_refcnt = ((PyObject *)local_148._0_8_)->ob_refcnt + 1;
      }
      object::operator=((object *)&local_118,(object *)local_148);
      object::~object((object *)local_148);
      object::~object((object *)(local_100 + 8));
    }
    else {
      iVar6 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar6 == 1) {
        local_110._8_8_ = (rec->scope).m_ptr;
        local_100._0_8_ = "__name__";
        local_100._8_8_ = (PyObject *)0x0;
        poVar8 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_110);
        goto LAB_0011785c;
      }
    }
    pPVar19 = (rec->scope).m_ptr;
    local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
    if (pPVar19 == (PyObject *)0x0) goto LAB_0011795b;
    iVar6 = PyObject_HasAttrString(pPVar19,"__qualname__");
    if (iVar6 == 1) {
      local_110._8_8_ = (rec->scope).m_ptr;
      local_100._0_8_ = "__qualname__";
      local_100._8_8_ = (PyObject *)0x0;
      poVar8 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_110);
      local_148._0_8_ = (poVar8->super_handle).m_ptr;
      if ((PyObject *)local_148._0_8_ != (PyObject *)0x0) {
        ((PyObject *)local_148._0_8_)->ob_refcnt = ((PyObject *)local_148._0_8_)->ob_refcnt + 1;
      }
      object::operator=(&local_b0,(object *)local_148);
      object::~object((object *)local_148);
      object::~object((object *)(local_100 + 8));
    }
    local_128.m_ptr = (PyObject *)0x0;
    local_c8.m_ptr = (PyObject *)0x0;
    if (local_b0.super_handle.m_ptr != (PyObject *)0x0) {
      local_110._0_8_ = PyUnicode_FromFormat("%U.%U",local_b0.super_handle.m_ptr,local_120.m_ptr);
      object::operator=((object *)&local_128,(object *)local_110);
      object::~object((object *)local_110);
      goto LAB_00117979;
    }
  }
  local_c8.m_ptr = (PyObject *)0x0;
  local_128.m_ptr = (PyObject *)0x0;
  object::operator=((object *)&local_128,(object *)&local_120);
LAB_00117979:
  if ((rec->field_0x48 & 8) != 0) {
    local_110._0_8_ = PyUnicode_FromFormat("%U__Meta",local_128.m_ptr);
    object::operator=((object *)&local_c8,(object *)local_110);
    object::~object((object *)local_110);
  }
  if (local_118.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_110,rec->name,(allocator<char> *)local_148);
  }
  else {
    str::str((str *)&local_98,(object *)&local_118);
    str::operator_cast_to_string((string *)local_e8,(str *)&local_98);
    plVar9 = (long *)std::__cxx11::string::append(local_e8);
    pPVar19 = (PyObject *)(plVar9 + 2);
    if ((PyObject *)*plVar9 == pPVar19) {
      local_138._0_8_ = pPVar19->ob_refcnt;
      local_138._8_8_ = plVar9[3];
      local_148._0_8_ = (PyObject *)local_138;
    }
    else {
      local_138._0_8_ = pPVar19->ob_refcnt;
      local_148._0_8_ = (PyObject *)*plVar9;
    }
    local_148._8_8_ = plVar9[1];
    *plVar9 = (long)pPVar19;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_148);
    local_110._0_8_ = local_100;
    pPVar19 = (PyObject *)(plVar9 + 2);
    if ((PyObject *)*plVar9 == pPVar19) {
      local_100._0_8_ = pPVar19->ob_refcnt;
      local_100._8_8_ = plVar9[3];
    }
    else {
      local_100._0_8_ = pPVar19->ob_refcnt;
      local_110._0_8_ = (PyObject *)*plVar9;
    }
    local_110._8_8_ = plVar9[1];
    *plVar9 = (long)pPVar19;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((PyObject *)local_148._0_8_ != (PyObject *)local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
    if ((_typeobject *)local_e8._0_8_ != (_typeobject *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    object::~object((object *)&local_98);
  }
  local_b8.m_ptr = (PyObject *)0x0;
  if ((rec->field_0x48 & 8) != 0) {
    local_148._0_8_ = (PyObject *)local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_110._0_8_,
               (char *)(local_110._0_8_ + (long)(Py_ssize_t *)local_110._8_8_));
    std::__cxx11::string::append(local_148);
    local_e8._0_8_ = PyUnicode_FromString(local_148._0_8_);
    local_98._M_dataplus._M_p = (pointer)(*_pthread_once)(&PyType_Type,0);
    object::operator=((object *)&local_b8,(object *)&local_98);
    object::~object((object *)&local_98);
    hVar2.m_ptr = local_b8.m_ptr;
    hVar13.m_ptr = local_c8.m_ptr;
    uVar4 = local_e8._0_8_;
    if (((PyTypeObject *)local_b8.m_ptr == (PyTypeObject *)0x0) ||
       (local_120.m_ptr == (PyObject *)0x0)) {
      pybind11_fail("generic_type::generic_type(): unable to create metaclass!");
    }
    local_e8._0_8_ = (_typeobject *)0x0;
    local_b8.m_ptr[0x35].ob_refcnt = uVar4;
    local_c8.m_ptr = (PyObject *)0x0;
    local_b8.m_ptr[0x36].ob_refcnt = (Py_ssize_t)hVar13.m_ptr;
    pPVar10 = (PyTypeObject *)strdup((char *)local_148._0_8_);
    hVar2.m_ptr[1].ob_type = pPVar10;
    hVar2.m_ptr[0x10].ob_refcnt = (Py_ssize_t)&PyType_Type;
    pbVar1 = (byte *)((long)&hVar2.m_ptr[10].ob_type + 1);
    *pbVar1 = *pbVar1 | 2;
    iVar6 = PyType_Ready(hVar2.m_ptr);
    if (iVar6 < 0) {
      pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
    }
    object::~object((object *)local_e8);
    if ((PyObject *)local_148._0_8_ != (PyObject *)local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
  }
  lVar11 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  tuple::tuple((tuple *)&local_c0,&(rec->bases).super_object);
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (char *)0x0;
  }
  else {
    sVar12 = strlen(rec->doc);
    __dest = (char *)PyObject_Malloc(sVar12 + 1);
    memcpy(__dest,rec->doc,sVar12 + 1);
  }
  hVar13.m_ptr = (PyObject *)(*_pthread_once)(&PyType_Type,0);
  local_a0.m_ptr = hVar13.m_ptr;
  if (((PyTypeObject *)hVar13.m_ptr != (PyTypeObject *)0x0) && (local_120.m_ptr != (PyObject *)0x0))
  {
    puVar14 = (undefined8 *)operator_new(0x68);
    puVar14[10] = 0;
    puVar14[0xb] = 0;
    puVar14[8] = 0;
    puVar14[9] = 0;
    puVar14[6] = 0;
    puVar14[7] = 0;
    puVar14[4] = 0;
    puVar14[5] = 0;
    puVar14[2] = 0;
    puVar14[3] = 0;
    puVar14[0xc] = 0;
    *(undefined2 *)(puVar14 + 0xc) = 0x101;
    *puVar14 = hVar13.m_ptr;
    puVar14[1] = rec->type_size;
    puVar14[2] = rec->init_holder;
    pmVar15 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this_00->direct_conversions,&local_78);
    puVar14[9] = pmVar15;
    *(byte *)((long)puVar14 + 0x61) = (byte)rec->field_0x48 >> 4 & 1;
    ppvVar16 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_78);
    *ppvVar16 = puVar14;
    local_148._0_8_ = hVar13.m_ptr;
    ppvVar17 = std::__detail::
               _Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->registered_types_py,(key_type *)local_148);
    *ppvVar17 = puVar14;
    pPVar10 = (PyTypeObject *)strdup((char *)local_110._0_8_);
    hVar13.m_ptr[1].ob_type = pPVar10;
    hVar13.m_ptr[2].ob_refcnt = rec->instance_size;
    if (lVar11 != 0) {
      local_148._8_8_ = local_c0.m_ptr;
      local_138._0_8_ = (PyObject *)0x0;
      local_138._8_8_ = (PyObject *)0x0;
      poVar8 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_148);
      local_e8._0_8_ = (poVar8->super_handle).m_ptr;
      if ((_typeobject *)local_e8._0_8_ != (_typeobject *)0x0) {
        (((_typeobject *)local_e8._0_8_)->ob_base).ob_base.ob_refcnt =
             (((_typeobject *)local_e8._0_8_)->ob_base).ob_base.ob_refcnt + 2;
      }
      hVar13.m_ptr[0x10].ob_refcnt = local_e8._0_8_;
      object::~object((object *)local_e8);
      object::~object((object *)(local_138 + 8));
      hVar2.m_ptr = local_c0.m_ptr;
      local_c0.m_ptr = (PyObject *)0x0;
      hVar13.m_ptr[0x15].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
      rec->field_0x48 = rec->field_0x48 | lVar11 != 1;
    }
    hVar5.m_ptr = local_b8.m_ptr;
    hVar3.m_ptr = local_120.m_ptr;
    hVar2.m_ptr = local_128.m_ptr;
    local_120.m_ptr = (PyObject *)0x0;
    hVar13.m_ptr[0x35].ob_refcnt = (Py_ssize_t)hVar3.m_ptr;
    local_128.m_ptr = (PyObject *)0x0;
    hVar13.m_ptr[0x36].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
    local_b8.m_ptr = (PyObject *)0x0;
    (hVar13.m_ptr)->ob_type = (PyTypeObject *)hVar5.m_ptr;
    hVar13.m_ptr[6].ob_refcnt = (Py_ssize_t)&hVar13.m_ptr[0x1b].ob_type;
    hVar13.m_ptr[6].ob_type = (PyTypeObject *)(hVar13.m_ptr + 0x2f);
    hVar13.m_ptr[7].ob_refcnt = (Py_ssize_t)&hVar13.m_ptr[0x2d].ob_type;
    hVar13.m_ptr[0x12].ob_type = (PyTypeObject *)init;
    hVar13.m_ptr[0x13].ob_type = (PyTypeObject *)new_instance;
    hVar13.m_ptr[3].ob_refcnt = (Py_ssize_t)rec->dealloc;
    hVar13.m_ptr[0xd].ob_refcnt = 0x18;
    pPVar10 = hVar13.m_ptr[10].ob_type;
    hVar13.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar10 & 0xffffffffffffb9ff | 0x600);
    bVar18 = rec->field_0x48;
    if ((bVar18 & 2) != 0) {
      hVar13.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar10 | 0x4600);
      hVar13.m_ptr[0x12].ob_refcnt = hVar13.m_ptr[2].ob_refcnt;
      hVar13.m_ptr[2].ob_refcnt = hVar13.m_ptr[2].ob_refcnt + 8;
      hVar13.m_ptr[0xf].ob_type = (PyTypeObject *)generic_getset;
      hVar13.m_ptr[0xb].ob_type = (PyTypeObject *)traverse;
      hVar13.m_ptr[0xc].ob_refcnt = (Py_ssize_t)clear;
      bVar18 = rec->field_0x48;
    }
    if ((bVar18 & 4) != 0) {
      hVar13.m_ptr[10].ob_refcnt = (Py_ssize_t)(hVar13.m_ptr + 0x34);
      hVar13.m_ptr[0x34].ob_refcnt = (Py_ssize_t)getbuffer;
      hVar13.m_ptr[0x34].ob_type = (PyTypeObject *)releasebuffer;
    }
    hVar13.m_ptr[0xb].ob_refcnt = (Py_ssize_t)__dest;
    (local_a8->super_object).super_handle.m_ptr = local_a0.m_ptr;
    iVar6 = PyType_Ready(hVar13.m_ptr);
    if (iVar6 < 0) {
      std::__cxx11::string::string<std::allocator<char>>(local_50,rec->name,&local_e9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
      local_98._M_dataplus._M_p = (pointer)*plVar9;
      psVar20 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_98._M_dataplus._M_p == psVar20) {
        local_98.field_2._M_allocated_capacity = *psVar20;
        local_98.field_2._8_8_ = plVar9[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar20;
      }
      local_98._M_string_length = plVar9[1];
      *plVar9 = (long)psVar20;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      error_string_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     &local_98,&local_70);
      plVar9 = (long *)std::__cxx11::string::append(local_e8);
      local_148._0_8_ = *plVar9;
      pPVar19 = (PyObject *)(plVar9 + 2);
      if ((PyObject *)local_148._0_8_ == pPVar19) {
        local_138._0_8_ = pPVar19->ob_refcnt;
        local_138._8_8_ = plVar9[3];
        local_148._0_8_ = (PyObject *)local_138;
      }
      else {
        local_138._0_8_ = pPVar19->ob_refcnt;
      }
      local_148._8_8_ = plVar9[1];
      *plVar9 = (long)pPVar19;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pybind11_fail((string *)local_148);
    }
    if (local_118.m_ptr != (PyObject *)0x0) {
      local_148._8_8_ = (local_a8->super_object).super_handle.m_ptr;
      local_138._0_8_ = "__module__";
      local_138._8_8_ = (PyObject *)0x0;
      accessor_policies::str_attr::set((handle)local_148._8_8_,"__module__",local_118);
      object::~object((object *)(local_138 + 8));
    }
    hVar2.m_ptr = (rec->scope).m_ptr;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      hVar3.m_ptr = (PyObject *)hVar13.m_ptr[0x35].ob_refcnt;
      if (hVar3.m_ptr != (PyObject *)0x0) {
        (hVar3.m_ptr)->ob_refcnt = (hVar3.m_ptr)->ob_refcnt + 1;
      }
      local_e8._0_8_ = (_typeobject *)0x0;
      local_138._8_8_ = (PyObject *)0x0;
      local_148._8_8_ = hVar2.m_ptr;
      local_138._0_8_ = hVar3.m_ptr;
      object::~object((object *)local_e8);
      accessor_policies::obj_attr::set(hVar2,hVar3,(local_a8->super_object).super_handle.m_ptr);
      object::~object((object *)(local_138 + 8));
      object::~object((object *)local_138);
    }
    if ((rec->field_0x48 & 1) != 0) {
      mark_parents_nonsimple(local_a8,(PyTypeObject *)hVar13.m_ptr);
    }
    local_a0.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_a0);
    object::~object((object *)&local_c0);
    object::~object((object *)&local_b8);
    if ((PyObject *)local_110._0_8_ != (PyObject *)local_100) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    }
    object::~object((object *)&local_c8);
    object::~object((object *)&local_128);
    object::~object(&local_b0);
    object::~object((object *)&local_118);
    object::~object((object *)&local_120);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,rec->name,(allocator<char> *)&local_98);
  plVar9 = (long *)std::__cxx11::string::append(local_e8);
  local_148._0_8_ = *plVar9;
  pPVar19 = (PyObject *)(plVar9 + 2);
  if ((PyObject *)local_148._0_8_ == pPVar19) {
    local_138._0_8_ = pPVar19->ob_refcnt;
    local_138._8_8_ = plVar9[3];
    local_148._0_8_ = (PyObject *)local_138;
  }
  else {
    local_138._0_8_ = pPVar19->ob_refcnt;
  }
  local_148._8_8_ = plVar9[1];
  *plVar9 = (long)pPVar19;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  pybind11_fail((string *)local_148);
}

Assistant:

void initialize(type_record *rec) {
        auto &internals = get_internals();
        auto tindex = std::type_index(*(rec->type));

        if (get_type_info(*(rec->type)))
            pybind11_fail("generic_type: type \"" + std::string(rec->name) +
                          "\" is already registered!");

        auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec->name));
        object scope_module;
        if (rec->scope) {
            if (hasattr(rec->scope, rec->name))
                pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec->name) +
                        "\": an object with that name is already defined");

            if (hasattr(rec->scope, "__module__")) {
                scope_module = rec->scope.attr("__module__");
            } else if (hasattr(rec->scope, "__name__")) {
                scope_module = rec->scope.attr("__name__");
            }
        }

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        /* Qualified names for Python >= 3.3 */
        object scope_qualname;
        if (rec->scope && hasattr(rec->scope, "__qualname__"))
            scope_qualname = rec->scope.attr("__qualname__");
        object ht_qualname, ht_qualname_meta;
        if (scope_qualname)
            ht_qualname = reinterpret_steal<object>(PyUnicode_FromFormat(
                "%U.%U", scope_qualname.ptr(), name.ptr()));
        else
            ht_qualname = name;
        if (rec->metaclass)
            ht_qualname_meta = reinterpret_steal<object>(
                PyUnicode_FromFormat("%U__Meta", ht_qualname.ptr()));
#endif

#if !defined(PYPY_VERSION)
        std::string full_name = (scope_module ? ((std::string) pybind11::str(scope_module) + "." + rec->name)
                                              : std::string(rec->name));
#else
        std::string full_name = std::string(rec->name);
#endif

        /* Create a custom metaclass if requested (used for static properties) */
        object metaclass;
        if (rec->metaclass) {
            std::string meta_name_ = full_name + "__Meta";
            object meta_name = reinterpret_steal<object>(PYBIND11_FROM_STRING(meta_name_.c_str()));
            metaclass = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
            if (!metaclass || !name)
                pybind11_fail("generic_type::generic_type(): unable to create metaclass!");

            /* Danger zone: from now (and until PyType_Ready), make sure to
               issue no Python C API calls which could potentially invoke the
               garbage collector (the GC will call type_traverse(), which will in
               turn find the newly constructed type in an invalid state) */

            auto type = (PyHeapTypeObject*) metaclass.ptr();
            type->ht_name = meta_name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
            /* Qualified names for Python >= 3.3 */
            type->ht_qualname = ht_qualname_meta.release().ptr();
#endif
            type->ht_type.tp_name = strdup(meta_name_.c_str());
            type->ht_type.tp_base = &PyType_Type;
            type->ht_type.tp_flags |= (Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE) &
                                      ~Py_TPFLAGS_HAVE_GC;

            if (PyType_Ready(&type->ht_type) < 0)
                pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
        }

        size_t num_bases = rec->bases.size();
        auto bases = tuple(rec->bases);

        char *tp_doc = nullptr;
        if (rec->doc && options::show_user_defined_docstrings()) {
            /* Allocate memory for docstring (using PyObject_MALLOC, since
               Python will free this later on) */
            size_t size = strlen(rec->doc) + 1;
            tp_doc = (char *) PyObject_MALLOC(size);
            memcpy((void *) tp_doc, rec->doc, size);
        }

        /* Danger zone: from now (and until PyType_Ready), make sure to
           issue no Python C API calls which could potentially invoke the
           garbage collector (the GC will call type_traverse(), which will in
           turn find the newly constructed type in an invalid state) */

        auto type_holder = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
        auto type = (PyHeapTypeObject*) type_holder.ptr();

        if (!type_holder || !name)
            pybind11_fail(std::string(rec->name) + ": Unable to create type object!");

        /* Register supplemental type information in C++ dict */
        detail::type_info *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) type;
        tinfo->type_size = rec->type_size;
        tinfo->init_holder = rec->init_holder;
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec->default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[type] = tinfo;

        /* Basic type attributes */
        type->ht_type.tp_name = strdup(full_name.c_str());
        type->ht_type.tp_basicsize = (ssize_t) rec->instance_size;

        if (num_bases > 0) {
            type->ht_type.tp_base = (PyTypeObject *) ((object) bases[0]).inc_ref().ptr();
            type->ht_type.tp_bases = bases.release().ptr();
            rec->multiple_inheritance |= num_bases > 1;
        }

        type->ht_name = name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        type->ht_qualname = ht_qualname.release().ptr();
#endif

        /* Metaclass */
        PYBIND11_OB_TYPE(type->ht_type) = (PyTypeObject *) metaclass.release().ptr();

        /* Supported protocols */
        type->ht_type.tp_as_number = &type->as_number;
        type->ht_type.tp_as_sequence = &type->as_sequence;
        type->ht_type.tp_as_mapping = &type->as_mapping;

        /* Supported elementary operations */
        type->ht_type.tp_init = (initproc) init;
        type->ht_type.tp_new = (newfunc) new_instance;
        type->ht_type.tp_dealloc = rec->dealloc;

        /* Support weak references (needed for the keep_alive feature) */
        type->ht_type.tp_weaklistoffset = offsetof(instance_essentials<void>, weakrefs);

        /* Flags */
        type->ht_type.tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
        type->ht_type.tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif
        type->ht_type.tp_flags &= ~Py_TPFLAGS_HAVE_GC;

        /* Support dynamic attributes */
        if (rec->dynamic_attr) {
            #if defined(PYPY_VERSION)
                pybind11_fail(std::string(rec->name) + ": dynamic attributes are "
                                                       "currently not supported in "
                                                       "conunction with PyPy!");
            #endif
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_GC;
            type->ht_type.tp_dictoffset = type->ht_type.tp_basicsize; // place the dict at the end
            type->ht_type.tp_basicsize += sizeof(PyObject *); // and allocate enough space for it
            type->ht_type.tp_getset = generic_getset;
            type->ht_type.tp_traverse = traverse;
            type->ht_type.tp_clear = clear;
        }

        if (rec->buffer_protocol) {
            type->ht_type.tp_as_buffer = &type->as_buffer;
#if PY_MAJOR_VERSION < 3
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_NEWBUFFER;
#endif
            type->as_buffer.bf_getbuffer = getbuffer;
            type->as_buffer.bf_releasebuffer = releasebuffer;
        }

        type->ht_type.tp_doc = tp_doc;

        m_ptr = type_holder.ptr();

        if (PyType_Ready(&type->ht_type) < 0)
            pybind11_fail(std::string(rec->name) + ": PyType_Ready failed (" +
                          detail::error_string() + ")!");

        if (scope_module) // Needed by pydoc
            attr("__module__") = scope_module;

        /* Register type with the parent scope */
        if (rec->scope)
            rec->scope.attr(handle(type->ht_name)) = *this;

        if (rec->multiple_inheritance)
            mark_parents_nonsimple(&type->ht_type);

        type_holder.release();
    }